

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall
KDIS::NETWORK::Connection::SetSendAddress(Connection *this,KString *A,KBOOL Multicast)

{
  ushort uVar1;
  in_addr_t iVar2;
  int iVar3;
  KException *this_00;
  int *piVar4;
  KCHAR8 *__s;
  undefined7 in_register_00000011;
  Connection *this_01;
  KINT32 yes;
  allocator<char> local_3d;
  undefined4 local_3c;
  KString local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->m_sSendAddress);
  (this->m_SendToAddr).sin_family = 0;
  (this->m_SendToAddr).sin_port = 0;
  (this->m_SendToAddr).sin_addr = 0;
  (this->m_SendToAddr).sin_zero[0] = '\0';
  (this->m_SendToAddr).sin_zero[1] = '\0';
  (this->m_SendToAddr).sin_zero[2] = '\0';
  (this->m_SendToAddr).sin_zero[3] = '\0';
  (this->m_SendToAddr).sin_zero[4] = '\0';
  (this->m_SendToAddr).sin_zero[5] = '\0';
  (this->m_SendToAddr).sin_zero[6] = '\0';
  (this->m_SendToAddr).sin_zero[7] = '\0';
  (this->m_SendToAddr).sin_family = 2;
  iVar2 = inet_addr((this->m_sSendAddress)._M_dataplus._M_p);
  (this->m_SendToAddr).sin_addr.s_addr = iVar2;
  uVar1 = (ushort)this->m_uiPort;
  (this->m_SendToAddr).sin_port = uVar1 << 8 | uVar1 >> 8;
  if ((int)CONCAT71(in_register_00000011,Multicast) != 0) {
    (*this->_vptr_Connection[4])(this,A);
    return;
  }
  local_3c = 1;
  iVar3 = setsockopt(this->m_iSocket[0],1,6,&local_3c,4);
  if (iVar3 != -1) {
    return;
  }
  this_01 = (Connection *)0x30;
  this_00 = (KException *)__cxa_allocate_exception();
  piVar4 = __errno_location();
  __s = getErrorText(this_01,*piVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_3d);
  KException::KException(this_00,&local_38,0xc);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Connection::SetSendAddress(const KString &A, KBOOL Multicast /*= false */ ) noexcept(false)
{
    m_sSendAddress = A;

    // Create the send to address structure
    memset( &m_SendToAddr, 0, sizeof( m_SendToAddr ) );
    m_SendToAddr.sin_family = AF_INET;
    m_SendToAddr.sin_addr.s_addr = inet_addr( m_sSendAddress.c_str() );
    m_SendToAddr.sin_port = htons( m_uiPort );

    if( Multicast )
    {
        AddMulticastAddress( A );

        // TODO: Do we need to disable broadcasting on the socket if we switch to multicast?
    }
    else
    {
        // Enable broadcasting on the send socket
        KINT32 yes = 1;
        KINT32 iRet = setsockopt( m_iSocket[SEND_SOCK], SOL_SOCKET, SO_BROADCAST, ( const char * )&yes, sizeof( yes ) );
        if( iRet == SOCKET_ERROR )
        {
            THROW_ERROR;
        }
    }
}